

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_itrans_recon_dc.c
# Opt level: O0

void ihevcd_itrans_recon_dc_chroma
               (UWORD8 *pu1_pred,UWORD8 *pu1_dst,WORD32 pred_strd,WORD32 dst_strd,
               WORD32 log2_trans_size,WORD16 i2_coeff_value)

{
  int iVar1;
  int iVar2;
  UWORD8 local_54;
  UWORD8 local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  WORD32 trans_size;
  WORD32 quant_out;
  WORD32 dc_value;
  WORD32 shift;
  WORD32 add;
  WORD32 col;
  WORD32 row;
  WORD16 i2_coeff_value_local;
  WORD32 log2_trans_size_local;
  WORD32 dst_strd_local;
  WORD32 pred_strd_local;
  UWORD8 *pu1_dst_local;
  UWORD8 *pu1_pred_local;
  
  iVar1 = 1 << ((byte)log2_trans_size & 0x1f);
  iVar2 = (int)i2_coeff_value;
  if (iVar2 * 0x40 + 0x40 >> 7 < 0x8000) {
    if (iVar2 * 0x40 + 0x40 >> 7 < -0x8000) {
      local_44 = -0x8000;
    }
    else {
      local_44 = iVar2 * 0x40 + 0x40 >> 7;
    }
    local_40 = local_44;
  }
  else {
    local_40 = 0x7fff;
  }
  if (local_40 * 0x40 + 0x800 >> 0xc < 0x8000) {
    if (local_40 * 0x40 + 0x800 >> 0xc < -0x8000) {
      local_4c = -0x8000;
    }
    else {
      local_4c = local_40 * 0x40 + 0x800 >> 0xc;
    }
    local_48 = local_4c;
  }
  else {
    local_48 = 0x7fff;
  }
  for (row = 0; row < iVar1; row = row + 1) {
    for (col = 0; col < iVar1; col = col + 1) {
      if ((int)((uint)pu1_pred[row * pred_strd + col * 2] + local_48) < 0x100) {
        if ((int)((uint)pu1_pred[row * pred_strd + col * 2] + local_48) < 0) {
          local_54 = '\0';
        }
        else {
          local_54 = pu1_pred[row * pred_strd + col * 2] + (char)local_48;
        }
        local_50 = local_54;
      }
      else {
        local_50 = 0xff;
      }
      pu1_dst[row * dst_strd + col * 2] = local_50;
    }
  }
  return;
}

Assistant:

void ihevcd_itrans_recon_dc_chroma(UWORD8 *pu1_pred,
                                   UWORD8 *pu1_dst,
                                   WORD32 pred_strd,
                                   WORD32 dst_strd,
                                   WORD32 log2_trans_size,
                                   WORD16 i2_coeff_value)
{
    WORD32 row, col;
    WORD32 add, shift;
    WORD32 dc_value, quant_out;
    WORD32 trans_size;


    trans_size = (1 << log2_trans_size);

    quant_out = i2_coeff_value;

    shift = IT_SHIFT_STAGE_1;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((quant_out * 64 + add) >> shift);
    shift = IT_SHIFT_STAGE_2;
    add = 1 << (shift - 1);
    dc_value = CLIP_S16((dc_value * 64 + add) >> shift);

    for(row = 0; row < trans_size; row++)
        for(col = 0; col < trans_size; col++)
            pu1_dst[row * dst_strd + (col << 1)] = CLIP_U8((pu1_pred[row * pred_strd + (col << 1)] + dc_value));

}